

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016cdcc8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016c7978,id,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016c7678;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend(&this->fGeo,nodeindexes);
  lVar1 = 0x1520;
  do {
    *(undefined ***)((long)(&(this->fGeo).super_TPZGeoTetrahedra + -2) + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoTetrahedra.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoTetrahedra.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1688);
  for (lVar1 = 0x1520; lVar1 != 0x1688; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoTetrahedra.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoTetrahedra.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
            fNodeIndexes + lVar1 + -0x48) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}